

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O3

V3f __thiscall
Imf_3_2::CubeMap::direction(CubeMap *this,CubeMapFace face,Box2i *dataWindow,V2f *positionInFace)

{
  int iVar1;
  int iVar2;
  V3f *dir;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  V3f VVar10;
  
  iVar2 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
  iVar1 = (((dataWindow->max).y - (dataWindow->min).y) + 1) / 6;
  if (iVar2 <= iVar1) {
    iVar1 = iVar2;
  }
  uVar3 = 0;
  if (1 < iVar1) {
    fVar6 = (float)(iVar1 + -1);
    auVar4._8_8_ = 0;
    auVar4._0_4_ = positionInFace->x;
    auVar4._4_4_ = positionInFace->y;
    auVar5._4_4_ = fVar6;
    auVar5._0_4_ = fVar6;
    auVar5._8_4_ = fVar6;
    auVar5._12_4_ = fVar6;
    auVar5 = divps(auVar4,auVar5);
    uVar3 = CONCAT44(auVar5._4_4_ + auVar5._4_4_ + -1.0,auVar5._0_4_ + auVar5._0_4_ + -1.0);
  }
  fVar6 = 1.0;
  *(undefined8 *)this = 0x3f800000;
  *(undefined4 *)(this + 8) = 0;
  fVar7 = (float)uVar3;
  uVar9 = (undefined4)((ulong)uVar3 >> 0x20);
  uVar8 = uVar9;
  switch(face) {
  case CUBEFACE_POS_X:
    goto switchD_00182a24_caseD_0;
  case CUBEFACE_NEG_X:
    fVar7 = -1.0;
    goto LAB_00182a75;
  case CUBEFACE_POS_Y:
    uVar8 = 0x3f800000;
    break;
  case CUBEFACE_NEG_Y:
    uVar8 = 0xbf800000;
    break;
  case CUBEFACE_POS_Z:
    uVar9 = 0x3f800000;
    break;
  case CUBEFACE_NEG_Z:
    uVar9 = 0xbf800000;
    break;
  default:
switchD_00182a24_default:
    VVar10.z = fVar6;
    VVar10.x = (float)(int)uVar3;
    VVar10.y = (float)(int)((ulong)uVar3 >> 0x20);
    return VVar10;
  }
  uVar3 = CONCAT44(uVar9,uVar8);
LAB_00182a75:
  *(float *)this = fVar7;
  fVar6 = fVar7;
switchD_00182a24_caseD_0:
  *(undefined8 *)(this + 4) = uVar3;
  goto switchD_00182a24_default;
}

Assistant:

V3f
direction (CubeMapFace face, const Box2i& dataWindow, const V2f& positionInFace)
{
    int sof = sizeOfFace (dataWindow);

    V2f pos;

    if (sof > 1)
    {
        pos = V2f (
            positionInFace.x / (sof - 1) * 2 - 1,
            positionInFace.y / (sof - 1) * 2 - 1);
    }
    else
    {
        pos = V2f (0, 0);
    }

    V3f dir (1, 0, 0);

    switch (face)
    {
        case CUBEFACE_POS_X:

            dir.x = 1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_X:

            dir.x = -1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Y:

            dir.x = pos.x;
            dir.y = 1;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_Y:

            dir.x = pos.x;
            dir.y = -1;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = 1;
            break;

        case CUBEFACE_NEG_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = -1;
            break;
    }

    return dir;
}